

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Var * __thiscall
kratos::Generator::var(Generator *this,string *var_name,uint32_t width,uint32_t size,bool is_signed)

{
  initializer_list<unsigned_int> __l;
  Var *pVVar1;
  allocator<unsigned_int> local_5d;
  uint32_t local_5c;
  iterator local_58;
  size_type local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *lst;
  uint32_t local_20;
  uint32_t uStack_1c;
  bool is_signed_local;
  uint32_t size_local;
  uint32_t width_local;
  string *var_name_local;
  Generator *this_local;
  
  local_58 = &local_5c;
  local_50 = 1;
  local_5c = size;
  lst._7_1_ = is_signed;
  local_20 = size;
  uStack_1c = width;
  _size_local = var_name;
  var_name_local = (string *)this;
  std::allocator<unsigned_int>::allocator(&local_5d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_5d);
  std::allocator<unsigned_int>::~allocator(&local_5d);
  local_30 = &local_48;
  pVVar1 = var(this,_size_local,uStack_1c,local_30,(bool)(lst._7_1_ & 1));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, uint32_t size, bool is_signed) {
    const auto &lst = std::vector<uint32_t>{size};
    return var(var_name, width, lst, is_signed);
}